

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O0

char ctemplate_htmlparser::jsparser_buffer_pop(jsparser_ctx *js)

{
  jsparser_ctx *js_local;
  
  if (js->buffer_start == js->buffer_end) {
    js_local._7_1_ = '\0';
  }
  else {
    js->buffer_end = js->buffer_end + -1;
    if (js->buffer_end < 0) {
      js->buffer_end = js->buffer_end + 0x12;
    }
    js_local._7_1_ = js->buffer[js->buffer_end];
  }
  return js_local._7_1_;
}

Assistant:

char jsparser_buffer_pop(jsparser_ctx *js)
{
  if (js->buffer_start == js->buffer_end) {
    return '\0';
  }

  js->buffer_end--;
  if (js->buffer_end < 0) {
    js->buffer_end += JSPARSER_RING_BUFFER_SIZE;
  }

  return js->buffer[js->buffer_end];
}